

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCh2.cpp
# Opt level: O0

void __thiscall
presolve::dev_kkt_check::KktChStep::addChange
          (KktChStep *this,int type,HighsInt row,HighsInt col,double valC,double dualC,double dualR)

{
  type_conflict tVar1;
  int iVar2;
  size_type sVar3;
  type *ptVar4;
  type_conflict *ptVar5;
  reference pvVar6;
  reference this_00;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pvVar7;
  int in_ECX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  value_type in_XMM2_Qa;
  HighsInt ind_24;
  size_t i_24;
  HighsInt ind_23;
  size_t i_23;
  HighsInt ind_22;
  size_t i_22;
  HighsInt ind_21;
  size_t i_21;
  HighsInt ind_20;
  size_t i_20;
  HighsInt ind_19;
  size_t i_19;
  HighsInt ind_18;
  size_t i_18;
  HighsInt ind_17;
  size_t i_17;
  HighsInt ind_16;
  size_t i_16;
  HighsInt ind_15;
  size_t i_15;
  HighsInt ind_14;
  size_t i_14;
  HighsInt ind_13;
  size_t i_13;
  HighsInt ind_12;
  size_t i_12;
  HighsInt ind_11;
  size_t i_11;
  HighsInt ind_10;
  size_t i_10;
  HighsInt ind_9;
  size_t i_9;
  HighsInt ind_8;
  size_t i_8;
  HighsInt ind_7;
  size_t i_7;
  HighsInt ind_6;
  size_t i_6;
  HighsInt ind_5;
  size_t i_5;
  HighsInt ind_4;
  size_t i_4;
  HighsInt ind_3;
  size_t i_3;
  HighsInt ind_2;
  size_t i_2;
  HighsInt ind_1;
  size_t i_1;
  HighsInt ind;
  size_t i;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> upd;
  reference in_stack_fffffffffffffbc0;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_fffffffffffffc48;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__x;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_fffffffffffffc50;
  ulong local_1e0;
  ulong local_1d0;
  ulong local_1c0;
  ulong local_1b0;
  ulong local_1a0;
  ulong local_190;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_180;
  ulong local_170;
  ulong local_160;
  ulong local_150;
  ulong local_140;
  ulong local_130;
  ulong local_120;
  ulong local_110;
  ulong local_100;
  ulong local_f0;
  ulong local_e0;
  ulong local_d0;
  ulong local_c0;
  ulong local_b0;
  ulong local_a0;
  ulong local_90;
  ulong local_80;
  ulong local_70;
  ulong local_60;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  value_type local_30;
  double local_20;
  int local_14;
  int local_c;
  
  local_30 = in_XMM2_Qa;
  local_20 = in_XMM0_Qa;
  local_14 = in_ECX;
  local_c = in_ESI;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x7c26bc);
  if (local_c == 1) {
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c2a1c);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c2a51);
    for (local_80 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_80 < sVar3; local_80 = local_80 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_80);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c2aad);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_80);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c2ad3);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)iVar2);
      *pvVar6 = tVar1;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c2b33);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c2b68);
    for (local_90 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_90 < sVar3; local_90 = local_90 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_90);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c2bc4);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_90);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c2bea);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),(long)iVar2);
      *pvVar6 = tVar1;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c2c4a);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c2c7f);
    for (local_a0 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_a0 < sVar3; local_a0 = local_a0 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_a0);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c2cdb);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_a0);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c2d01);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)iVar2);
      *pvVar6 = tVar1;
    }
  }
  else if (local_c == 2) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)local_14);
    *pvVar6 = local_30;
  }
  else if (local_c == 3) {
    if ((local_20 != 0.0) || (NAN(local_20))) {
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x7c2fef);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x7c3024);
      for (local_d0 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_d0 < sVar3; local_d0 = local_d0 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_d0);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c3080);
        iVar2 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_d0);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c30a6);
        tVar1 = *ptVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)iVar2);
        *pvVar6 = tVar1;
      }
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x7c3106);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x7c313b);
      for (local_e0 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_e0 < sVar3; local_e0 = local_e0 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_e0);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c3197);
        iVar2 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_e0);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c31bd);
        tVar1 = *ptVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)iVar2);
        *pvVar6 = tVar1;
      }
    }
  }
  else if (local_c == 4) {
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c3224);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c3259);
    for (local_f0 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_f0 < sVar3; local_f0 = local_f0 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_f0);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c32b5);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_f0);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c32db);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)iVar2);
      *pvVar6 = tVar1;
    }
  }
  else if (local_c == 5) {
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c3340);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c3375);
    for (local_100 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_100 < sVar3; local_100 = local_100 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_100);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c33d1);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_100);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c33f7);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)iVar2);
      *pvVar6 = tVar1;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c3457);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c348c);
    for (local_110 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_110 < sVar3; local_110 = local_110 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_110);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c34e8);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_110);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c350e);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),(long)iVar2);
      *pvVar6 = tVar1;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c356e);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c35a3);
    for (local_120 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_120 < sVar3; local_120 = local_120 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_120);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c35ff);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_120);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c3625);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)iVar2);
      *pvVar6 = tVar1;
    }
  }
  else if (local_c == 6) {
    if ((local_20 != 0.0) || (NAN(local_20))) {
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x7c39ed);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x7c3a22);
      for (local_160 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_160 < sVar3; local_160 = local_160 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_160);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c3a7e);
        iVar2 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_160);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c3aa4);
        tVar1 = *ptVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)iVar2);
        *pvVar6 = tVar1;
      }
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x7c3b04);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x7c3b39);
      for (local_170 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_170 < sVar3; local_170 = local_170 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_170);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c3b95);
        iVar2 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_170);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c3bbb);
        tVar1 = *ptVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)iVar2);
        *pvVar6 = tVar1;
      }
    }
  }
  else if (local_c == 7) {
    if ((local_20 != 0.0) || (NAN(local_20))) {
      this_00 = std::
                stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                       *)0x7c3c3b);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (this_00,in_stack_fffffffffffffc48);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x7c3c70);
      local_180 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x0;
      while (__x = local_180,
            pvVar7 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                     size(&local_48), __x < pvVar7) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,(size_type)local_180);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c3ccc);
        iVar2 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,(size_type)local_180);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c3cf2);
        tVar1 = *ptVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)iVar2);
        *pvVar6 = tVar1;
        local_180 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    ((long)&(local_180->
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
      }
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x7c3d52);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (this_00,__x);
      std::
      stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
      ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
             *)0x7c3d87);
      for (local_190 = 0;
          sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_48), local_190 < sVar3; local_190 = local_190 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_190);
        ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c3de3);
        iVar2 = *ptVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_48,local_190);
        ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c3e09);
        tVar1 = *ptVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)iVar2);
        *pvVar6 = tVar1;
      }
    }
  }
  else if (local_c == 0xb) {
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c3e70);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c3e9f);
    for (local_1a0 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_1a0 < sVar3; local_1a0 = local_1a0 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1a0);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c3ef5);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1a0);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c3f1b);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)iVar2);
      *pvVar6 = tVar1;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c3f75);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c3fa4);
    for (local_1b0 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_1b0 < sVar3; local_1b0 = local_1b0 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1b0);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c3ffa);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1b0);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c4020);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)iVar2);
      *pvVar6 = tVar1;
    }
  }
  else if (local_c == 0xc) {
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c407f);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c40ae);
    for (local_1c0 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_1c0 < sVar3; local_1c0 = local_1c0 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1c0);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c4104);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1c0);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c412a);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)iVar2);
      *pvVar6 = tVar1;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c4184);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c41b3);
    for (local_1d0 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_1d0 < sVar3; local_1d0 = local_1d0 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1d0);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c4209);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1d0);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c422f);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),(long)iVar2);
      *pvVar6 = tVar1;
    }
    in_stack_fffffffffffffbc0 =
         std::
         stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
         ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                *)0x7c4289);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c42b8);
    for (local_1e0 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_1e0 < sVar3; local_1e0 = local_1e0 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1e0);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c430e);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_1e0);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c4334);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)iVar2);
      *pvVar6 = tVar1;
    }
  }
  else if (local_c == 0x11) {
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c368a);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c36bf);
    for (local_130 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_130 < sVar3; local_130 = local_130 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_130);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c371b);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_130);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c3741);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)iVar2);
      *pvVar6 = tVar1;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c37a1);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c37d6);
    for (local_140 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_140 < sVar3; local_140 = local_140 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_140);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c3832);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_140);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c3858);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),(long)iVar2);
      *pvVar6 = tVar1;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c38b8);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c38ed);
    for (local_150 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_150 < sVar3; local_150 = local_150 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_150);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c3949);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_150);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c396f);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)iVar2);
      *pvVar6 = tVar1;
    }
  }
  else if (local_c == 0x16) {
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c2da3);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c2dd8);
    for (local_b0 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_b0 < sVar3; local_b0 = local_b0 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_b0);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c2e34);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_b0);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c2e5a);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)iVar2);
      *pvVar6 = tVar1;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c2eba);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c2eef);
    for (local_c0 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_c0 < sVar3; local_c0 = local_c0 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_c0);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c2f4b);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_c0);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c2f71);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)iVar2);
      *pvVar6 = tVar1;
    }
  }
  else if ((local_c != 0x79) && (local_c == 0xab)) {
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c27c3);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c27f8);
    for (local_60 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_60 < sVar3; local_60 = local_60 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_60);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c2854);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_60);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c287a);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)iVar2);
      *pvVar6 = tVar1;
    }
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::top((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c2900);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::pop((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
           *)0x7c2935);
    for (local_70 = 0;
        sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (&local_48), local_70 < sVar3; local_70 = local_70 + 1) {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_70);
      ptVar4 = std::get<0ul,int,double>((pair<int,_double> *)0x7c2991);
      iVar2 = *ptVar4;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (&local_48,local_70);
      ptVar5 = std::get<1ul,int,double>((pair<int,_double> *)0x7c29b7);
      tVar1 = *ptVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)iVar2);
      *pvVar6 = tVar1;
    }
  }
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
            (in_stack_fffffffffffffbc0);
  return;
}

Assistant:

void KktChStep::addChange(int type, HighsInt row, HighsInt col, double valC,
                          double dualC, double dualR) {
  // when updating fill new values for b, c, bounds in Rb RcolCost RcolUpper,
  // RcolLower
  vector<pair<HighsInt, double>> upd;

  switch (type) {
    case 171:  // new bounds from doubleton equation, retrieve old ones
      upd = rLowers.top();
      rLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RrowLower[ind] = get<1>(upd[i]);
      }
      upd = rUppers.top();
      rUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RrowUpper[ind] = get<1>(upd[i]);
      }
      break;
    case 1:  // row singleton
      upd = cLowers.top();
      cLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolLower[ind] = get<1>(upd[i]);
      }
      upd = cUppers.top();
      cUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolUpper[ind] = get<1>(upd[i]);
      }
      upd = costs.top();
      costs.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolCost[ind] = get<1>(upd[i]);
      }
      break;
    case 2:  // each variable at forcing row: rowDual is cost here
      RcolCost[col] = dualR;
      break;
    case 22:  //
      upd = rLowers.top();
      rLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RrowLower[ind] = get<1>(upd[i]);
      }
      upd = rUppers.top();
      rUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RrowUpper[ind] = get<1>(upd[i]);
      }
      break;
    case 3:  // the row that is forcing
      if (valC != 0) {
        upd = rLowers.top();
        rLowers.pop();
        for (size_t i = 0; i < upd.size(); i++) {
          HighsInt ind = get<0>(upd[i]);
          RrowLower[ind] = get<1>(upd[i]);
        }
        upd = rUppers.top();
        rUppers.pop();
        for (size_t i = 0; i < upd.size(); i++) {
          HighsInt ind = get<0>(upd[i]);
          RrowUpper[ind] = get<1>(upd[i]);
        }
      }
      break;
    case 4:  // implied free column singleton (also from duplicate row)
      upd = costs.top();
      costs.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolCost[ind] = get<1>(upd[i]);
      }
      break;
    case 5:  // doubleton eq with singleton col
      upd = cLowers.top();
      cLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolLower[ind] = get<1>(upd[i]);
      }
      upd = cUppers.top();
      cUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolUpper[ind] = get<1>(upd[i]);
      }
      upd = costs.top();
      costs.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolCost[ind] = get<1>(upd[i]);
      }
      break;
    case 17: {  // doubleton equation
      upd = cLowers.top();
      cLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolLower[ind] = get<1>(upd[i]);
      }
      upd = cUppers.top();
      cUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolUpper[ind] = get<1>(upd[i]);
      }
      upd = costs.top();
      costs.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolCost[ind] = get<1>(upd[i]);
      }
      break;
    }
    case 6:  // empty column, dominated column or weakly dominated
      if (valC != 0) {
        upd = rLowers.top();
        rLowers.pop();
        for (size_t i = 0; i < upd.size(); i++) {
          HighsInt ind = get<0>(upd[i]);
          RrowLower[ind] = get<1>(upd[i]);
        }
        upd = rUppers.top();
        rUppers.pop();
        for (size_t i = 0; i < upd.size(); i++) {
          HighsInt ind = get<0>(upd[i]);
          RrowUpper[ind] = get<1>(upd[i]);
        }
      }
      break;
    case 7:  // fixed variable
      if (valC != 0) {
        upd = rLowers.top();
        rLowers.pop();
        for (size_t i = 0; i < upd.size(); i++) {
          HighsInt ind = get<0>(upd[i]);
          RrowLower[ind] = get<1>(upd[i]);
        }
        upd = rUppers.top();
        rUppers.pop();
        for (size_t i = 0; i < upd.size(); i++) {
          HighsInt ind = get<0>(upd[i]);
          RrowUpper[ind] = get<1>(upd[i]);
        }
      }
      break;
    case 11:  // empty row from duplicate rows
      upd = rLowers.top();
      rLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RrowLower[ind] = get<1>(upd[i]);
      }
      upd = rUppers.top();
      rUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RrowUpper[ind] = get<1>(upd[i]);
      }
      break;
    case 12:  // doubleton eq from duplicate rows;
      upd = cLowers.top();
      cLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolLower[ind] = get<1>(upd[i]);
      }
      upd = cUppers.top();
      cUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolUpper[ind] = get<1>(upd[i]);
      }
      upd = costs.top();
      costs.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolCost[ind] = get<1>(upd[i]);
      }
      break;
    case 121:  //
      break;   /*
  case 14: //two duplicate columns by one
         colValue[col] = valC;
         colDual[col] = dualC;
         RcolLower = cLowers.top(); cLowers.pop();
         RcolUpper = cUppers.top(); cUppers.pop();
         break;
  case 15: //sing variable on initEq
         flagRow[row] = true;
         rowDual[row] = dualR;
         break;*/
  }
}